

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O1

void __thiscall
QItemSelectionModelPrivate::columnsAboutToBeRemoved
          (QItemSelectionModelPrivate *this,QModelIndex *parent,int start,int end)

{
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  *pQVar1;
  QPersistentModelIndex *this_00;
  QObject *sender;
  QAbstractItemModel *pQVar2;
  bool bVar3;
  int iVar4;
  parameter_type pQVar5;
  uint uVar6;
  undefined4 in_register_0000000c;
  QAbstractItemModel *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<QItemSelectionRange> local_90;
  QModelIndex local_78;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  sender = (this->super_QObjectPrivate).super_QObjectData.q_ptr;
  this_00 = &this->currentIndex;
  bVar3 = QPersistentModelIndex::isValid(this_00);
  if (!bVar3) goto LAB_0046a6db;
  QPersistentModelIndex::parent(&local_58,this_00);
  if ((((parent->r != local_58.r) || (parent->c != local_58.c)) || (parent->i != local_58.i)) ||
     ((parent->m).ptr != local_58.m.ptr)) goto LAB_0046a6db;
  iVar4 = QPersistentModelIndex::column(this_00);
  if (iVar4 < start) goto LAB_0046a6db;
  iVar4 = QPersistentModelIndex::column(this_00);
  if (end < iVar4) goto LAB_0046a6db;
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QPersistentModelIndex::operator_cast_to_QModelIndex(this_00);
  if (start < 1) {
    pQVar1 = &this->model;
    pQVar5 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
             ::value(pQVar1);
    if (pQVar5 != (parameter_type)0x0) {
      QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
      ::value(pQVar1);
      local_58.r = -1;
      local_58.c = -1;
      local_58.i = 0;
      local_58.m.ptr = (QAbstractItemModel *)0x0;
      iVar4 = (*(((pQVar1->super_QPropertyData<QAbstractItemModel_*>).val)->super_QObject).
                _vptr_QObject[0x10])();
      if (end < iVar4 + -1) {
        QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
        ::value(pQVar1);
        pQVar7 = (pQVar1->super_QPropertyData<QAbstractItemModel_*>).val;
        uVar6 = end + 1;
        goto LAB_0046a570;
      }
    }
    local_58.r = -1;
    local_58.c = -1;
    local_58.i = 0;
    local_58.m.ptr = (QAbstractItemModel *)0x0;
  }
  else {
    QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
    ::value(&this->model);
    pQVar7 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
    uVar6 = start - 1;
LAB_0046a570:
    (*(pQVar7->super_QObject)._vptr_QObject[0xc])
              (&local_58,pQVar7,(ulong)(uint)local_78.r,(ulong)uVar6,parent);
  }
  QPersistentModelIndex::operator=(this_00,&local_58);
  QPersistentModelIndex::operator_cast_to_QModelIndex(this_00);
  local_58.r = 0;
  local_58.c = 0;
  local_58.i = (quintptr)&local_90;
  local_58.m.ptr = (QAbstractItemModel *)&local_78;
  QMetaObject::activate(sender,&QItemSelectionModel::staticMetaObject,1,(void **)&local_58);
  iVar4 = QPersistentModelIndex::row(this_00);
  if (iVar4 != local_78.r) {
    QPersistentModelIndex::operator_cast_to_QModelIndex(this_00);
    local_58.r = 0;
    local_58.c = 0;
    local_58.i = (quintptr)&local_90;
    local_58.m.ptr = (QAbstractItemModel *)&local_78;
    QMetaObject::activate(sender,&QItemSelectionModel::staticMetaObject,2,(void **)&local_58);
  }
  QPersistentModelIndex::operator_cast_to_QModelIndex(this_00);
  local_58.r = 0;
  local_58.c = 0;
  local_58.i = (quintptr)&local_90;
  local_58.m.ptr = (QAbstractItemModel *)&local_78;
  QMetaObject::activate(sender,&QItemSelectionModel::staticMetaObject,3,(void **)&local_58);
LAB_0046a6db:
  pQVar1 = &this->model;
  local_58.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  ::value(pQVar1);
  pQVar7 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
  (*(pQVar7->super_QObject)._vptr_QObject[0xc])(&local_58,pQVar7,0,(ulong)(uint)start,parent);
  local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  ::value(pQVar1);
  pQVar7 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
  QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
  ::value(pQVar1);
  pQVar2 = (this->model).super_QPropertyData<QAbstractItemModel_*>.val;
  iVar4 = (*(pQVar2->super_QObject)._vptr_QObject[0xf])(pQVar2,parent);
  (*(pQVar7->super_QObject)._vptr_QObject[0xc])
            (&local_78,pQVar7,(ulong)(iVar4 - 1),CONCAT44(in_register_0000000c,end),parent);
  QItemSelection::QItemSelection((QItemSelection *)&local_90,&local_58,&local_78);
  (*sender->_vptr_QObject[0xe])(sender,&local_90,4);
  QArrayDataPointer<QItemSelectionRange>::~QArrayDataPointer(&local_90);
  QItemSelection::merge
            (&this->ranges,&this->currentSelection,
             (SelectionFlags)
             (this->currentCommand).super_QFlagsStorageHelper<QItemSelectionModel::SelectionFlag,_4>
             .super_QFlagsStorage<QItemSelectionModel::SelectionFlag>.i);
  if ((this->currentSelection).super_QList<QItemSelectionRange>.d.size != 0) {
    QList<QItemSelectionRange>::clear(&(this->currentSelection).super_QList<QItemSelectionRange>);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QItemSelectionModelPrivate::columnsAboutToBeRemoved(const QModelIndex &parent,
                                                            int start, int end)
{
    Q_Q(QItemSelectionModel);

    // update current index
    if (currentIndex.isValid() && parent == currentIndex.parent()
        && currentIndex.column() >= start && currentIndex.column() <= end) {
        QModelIndex old = currentIndex;
        if (start > 0) {
            // there are columns to the left of the change
            currentIndex = model->index(old.row(), start - 1, parent);
        } else if (model.value() && end < model->columnCount() - 1) {
            // there are columns to the right of the change
            currentIndex = model->index(old.row(), end + 1, parent);
        } else {
            // there are no columns left in the table
            currentIndex = QModelIndex();
        }
        emit q->currentChanged(currentIndex, old);
        if (currentIndex.row() != old.row())
            emit q->currentRowChanged(currentIndex, old);
        emit q->currentColumnChanged(currentIndex, old);
    }

    // update selections
    QModelIndex tl = model->index(0, start, parent);
    QModelIndex br = model->index(model->rowCount(parent) - 1, end, parent);
    q->select(QItemSelection(tl, br), QItemSelectionModel::Deselect);
    finalize();
}